

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StreamSep.h
# Opt level: O0

StreamSepMaker * __thiscall
Hpipe::StreamSepMaker::rm_beg(StreamSepMaker *__return_storage_ptr__,StreamSepMaker *this,uint n)

{
  uint local_50 [4];
  string local_40;
  undefined1 local_1d;
  uint local_1c;
  StreamSepMaker *pSStack_18;
  uint n_local;
  StreamSepMaker *this_local;
  StreamSepMaker *res;
  
  local_1d = 0;
  local_1c = n;
  pSStack_18 = this;
  this_local = __return_storage_ptr__;
  std::__cxx11::string::string((string *)&local_40);
  StreamSepMaker(__return_storage_ptr__,this,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::size();
  local_50[0] = std::__cxx11::string::size();
  std::min<unsigned_int>(local_50,&local_1c);
  std::__cxx11::string::resize((ulong)&__return_storage_ptr__->beg);
  return __return_storage_ptr__;
}

Assistant:

StreamSepMaker rm_beg( unsigned n ) {
        StreamSepMaker res = *this;
        res.beg.resize( beg.size() - std::min( unsigned( beg.size() ), n ) );
        return res;
    }